

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

Am_Value * __thiscall
Web_Context::Get(Web_Context *this,Am_Object_Advanced *object,Am_Slot_Key key,Am_Slot_Flags flags)

{
  int iVar1;
  Input_Port *this_00;
  Am_Value *pAVar2;
  undefined4 extraout_var;
  Am_Slot slot;
  Am_Slot local_28;
  
  if ((flags & 4) != 0) {
    iVar1 = (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[1])
                      (Am_Empty_Constraint_Context,object,key);
    return (Am_Value *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = Input_Port::Search(this->owner->in_list,object,key);
  if (this_00 != (Input_Port *)0x0) {
    Am_Slot::Validate(&this_00->context);
    pAVar2 = Am_Slot::Get(&this_00->context);
    return pAVar2;
  }
  local_28 = Am_Object_Advanced::Get_Slot(object,key);
  Am_Slot::Add_Dependency(&local_28,&(this->owner->interface).super_Am_Constraint);
  Am_Slot::Validate(&local_28);
  pAVar2 = Am_Slot::Get(&local_28);
  return pAVar2;
}

Assistant:

const Am_Value &
Web_Context::Get(const Am_Object_Advanced &object, Am_Slot_Key key,
                 Am_Slot_Flags flags)
{
  if (flags & Am_NO_DEPENDENCY)
    return Am_Empty_Constraint_Context->Get(object, key, flags);

  Input_Port *curr = owner->in_list->Search(object, key);
  if (curr) {
    curr->context.Validate();
    return curr->context.Get();
  }
  Am_Slot slot = object.Get_Slot(key);
  slot.Add_Dependency(*owner);
  slot.Validate();
  return slot.Get();
}